

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

void __thiscall Fl_Type::read_property(Fl_Type *this,char *c)

{
  int iVar1;
  char *pcVar2;
  fd_set *in_RCX;
  fd_set *__writefds;
  timeval *in_R8;
  
  iVar1 = strcmp(c,"label");
  if (iVar1 == 0) {
    pcVar2 = read_word(0);
    label(this,pcVar2);
    return;
  }
  iVar1 = strcmp(c,"user_data");
  if (iVar1 == 0) {
    pcVar2 = read_word(0);
    user_data(this,pcVar2);
    return;
  }
  iVar1 = strcmp(c,"user_data_type");
  if (iVar1 == 0) {
    pcVar2 = read_word(0);
    user_data_type(this,pcVar2);
    return;
  }
  iVar1 = strcmp(c,"callback");
  if (iVar1 != 0) {
    iVar1 = strcmp(c,"comment");
    if (iVar1 == 0) {
      pcVar2 = read_word(0);
      comment(this,pcVar2);
      return;
    }
    iVar1 = strcmp(c,"open");
    if (iVar1 != 0) {
      iVar1 = strcmp(c,"selected");
      if (iVar1 != 0) {
        read_error("Unknown property \"%s\"",c);
        return;
      }
      select((int)this,(fd_set *)&DAT_00000001,__writefds,in_RCX,in_R8);
      return;
    }
    this->open_ = '\x01';
    return;
  }
  pcVar2 = read_word(0);
  callback(this,pcVar2);
  return;
}

Assistant:

void Fl_Type::read_property(const char *c) {
  if (!strcmp(c,"label"))
    label(read_word());
  else if (!strcmp(c,"user_data"))
    user_data(read_word());
  else if (!strcmp(c,"user_data_type"))
    user_data_type(read_word());
  else if (!strcmp(c,"callback"))
    callback(read_word());
  else if (!strcmp(c,"comment"))
    comment(read_word());
  else if (!strcmp(c,"open"))
    open_ = 1;
  else if (!strcmp(c,"selected"))
    select(this,1);
  else
    read_error("Unknown property \"%s\"", c);
}